

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O3

void __thiscall libtorrent::upnp::delete_port_mapping(upnp *this,rootdevice *d,port_mapping_t i)

{
  pointer pmVar1;
  char *pcVar2;
  double in_XMM0_Qa;
  char soap [1024];
  
  if ((d->upnp_connection).
      super___shared_ptr<libtorrent::aux::http_connection,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pmVar1 = (d->mapping).
             super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
             .
             super__Vector_base<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar2 = "TCP";
    if (pmVar1[i.m_val].super_base_mapping.protocol == udp) {
      pcVar2 = "UDP";
    }
    snprintf(soap,0x400,
             "<?xml version=\"1.0\"?>\n<s:Envelope xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/\"><s:Body><u:%s xmlns:u=\"%s\"><NewRemoteHost></NewRemoteHost><NewExternalPort>%u</NewExternalPort><NewProtocol>%s</NewProtocol></u:%s></s:Body></s:Envelope>"
             ,"DeletePortMapping",(d->service_namespace)._M_dataplus._M_p,
             (ulong)(uint)pmVar1[i.m_val].super_base_mapping.external_port,pcVar2,
             "DeletePortMapping");
    post(this,d,soap,"DeletePortMapping");
    return;
  }
  log(this,in_XMM0_Qa);
  return;
}

Assistant:

void upnp::delete_port_mapping(rootdevice& d, port_mapping_t const i)
{
	TORRENT_ASSERT(is_single_thread());

	TORRENT_ASSERT(d.magic == 1337);

	if (!d.upnp_connection)
	{
		TORRENT_ASSERT(d.disabled);
#ifndef TORRENT_DISABLE_LOGGING
		log("unmapping %u aborted", static_cast<int>(i));
#endif
		return;
	}

	char const* soap_action = "DeletePortMapping";

	char soap[1024];
	std::snprintf(soap, sizeof(soap), "<?xml version=\"1.0\"?>\n"
		"<s:Envelope xmlns:s=\"http://schemas.xmlsoap.org/soap/envelope/\" "
		"s:encodingStyle=\"http://schemas.xmlsoap.org/soap/encoding/\">"
		"<s:Body><u:%s xmlns:u=\"%s\">"
		"<NewRemoteHost></NewRemoteHost>"
		"<NewExternalPort>%u</NewExternalPort>"
		"<NewProtocol>%s</NewProtocol>"
		"</u:%s></s:Body></s:Envelope>"
		, soap_action, d.service_namespace.c_str()
		, d.mapping[i].external_port
		, to_string(d.mapping[i].protocol)
		, soap_action);

	post(d, soap, soap_action);
}